

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void addArgumentToVtab(Parse *pParse)

{
  Table *pTable;
  char *zArg;
  sqlite3 *db;
  int n;
  char *z;
  Parse *pParse_local;
  
  if (((pParse->sArg).z != (char *)0x0) && (pParse->pNewTable != (Table *)0x0)) {
    pTable = pParse->pNewTable;
    zArg = sqlite3DbStrNDup(pParse->db,(pParse->sArg).z,(long)(int)(pParse->sArg).n);
    addModuleArgument(pParse,pTable,zArg);
  }
  return;
}

Assistant:

static void addArgumentToVtab(Parse *pParse){
  if( pParse->sArg.z && pParse->pNewTable ){
    const char *z = (const char*)pParse->sArg.z;
    int n = pParse->sArg.n;
    sqlite3 *db = pParse->db;
    addModuleArgument(pParse, pParse->pNewTable, sqlite3DbStrNDup(db, z, n));
  }
}